

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

void __thiscall
Imf_3_2::SampleCountChannel::SampleCountChannel(SampleCountChannel *this,DeepImageLevel *level)

{
  ImageLevel *in_RSI;
  ImageChannel *in_RDI;
  
  ImageChannel::ImageChannel(in_RDI,in_RSI,1,1,false);
  in_RDI->_vptr_ImageChannel = (_func_int **)&PTR_pixelType_00146c60;
  in_RDI[1]._vptr_ImageChannel = (_func_int **)0x0;
  in_RDI[1]._level = (ImageLevel *)0x0;
  in_RDI[1]._xSampling = 0;
  in_RDI[1]._ySampling = 0;
  in_RDI[1]._pLinear = false;
  *(undefined3 *)&in_RDI[1].field_0x19 = 0;
  in_RDI[1]._pixelsPerRow = 0;
  *(undefined8 *)&in_RDI[1]._pixelsPerColumn = 0;
  in_RDI[1]._numPixels = 0;
  in_RDI[2]._vptr_ImageChannel = (_func_int **)0x0;
  (*in_RDI->_vptr_ImageChannel[3])();
  return;
}

Assistant:

SampleCountChannel::SampleCountChannel (DeepImageLevel& level)
    : ImageChannel (level, 1, 1, false)
    , _numSamples (0)
    , _base (0)
    , _sampleListSizes (0)
    , _sampleListPositions (0)
    , _totalNumSamples (0)
    , _totalSamplesOccupied (0)
    , _sampleBufferSize (0)
{
    resize ();
}